

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_striped_sse2_128_64.c
# Opt level: O3

parasail_result_t *
parasail_sw_stats_striped_profile_sse2_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  long *plVar1;
  int iVar2;
  char *s1;
  parasail_matrix_t *ppVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  ushort uVar7;
  uint uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  bool bVar11;
  __m128i *palVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  parasail_result_t *result;
  parasail_profile_t *profile_00;
  parasail_result_t *result_00;
  __m128i *b;
  __m128i *palVar17;
  __m128i *palVar18;
  __m128i *palVar19;
  __m128i *b_00;
  __m128i *palVar20;
  __m128i *b_01;
  __m128i *palVar21;
  __m128i *b_02;
  __m128i *b_03;
  __m128i *b_04;
  __m128i *b_05;
  __m128i *palVar22;
  long lVar23;
  longlong lVar24;
  bool bVar25;
  ulong uVar26;
  __m128i *palVar27;
  long lVar28;
  longlong lVar29;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  longlong extraout_RDX_05;
  long lVar30;
  long lVar31;
  long lVar32;
  __m128i *ptr;
  uint uVar33;
  __m128i *palVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  __m128i *ptr_00;
  ulong uVar39;
  __m128i *ptr_01;
  __m128i *ptr_02;
  ulong uVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  long lVar52;
  long lVar53;
  longlong lVar72;
  long lVar73;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar74 [16];
  __m128i_64_t B_1;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  int iVar78;
  int iVar92;
  int iVar94;
  undefined1 auVar79 [16];
  int iVar96;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  int iVar93;
  int iVar95;
  int iVar97;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  __m128i_64_t B_4;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  __m128i_64_t B;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  long lVar115;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  int iVar128;
  __m128i_64_t A;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  longlong lVar135;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i c_04;
  __m128i c_05;
  __m128i c_06;
  int local_224;
  __m128i *local_218;
  __m128i *local_210;
  __m128i *local_208;
  long local_200;
  __m128i *local_1f8;
  __m128i *local_1f0;
  __m128i *local_1e8;
  __m128i *local_1e0;
  ulong uStack_1c0;
  ulong local_1a8;
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  long local_138;
  long lStack_130;
  longlong local_110;
  ulong uStack_60;
  
  s1 = profile->s1;
  ppVar3 = profile->matrix;
  result = parasail_sw_striped_profile_sse2_128_64(profile,s2,s2Len,open,gap);
  iVar13 = parasail_result_is_saturated(result);
  if (iVar13 != 0) {
    return result;
  }
  iVar13 = result->end_query;
  iVar2 = result->end_ref;
  profile_00 = parasail_profile_create_stats_sse_128_64(s1,iVar13 + 1,ppVar3);
  if (profile_00 == (parasail_profile_t *)0x0) {
    parasail_sw_stats_striped_profile_sse2_128_64_cold_8();
  }
  else {
    pvVar4 = (profile_00->profile64).score;
    if (pvVar4 == (void *)0x0) {
      parasail_sw_stats_striped_profile_sse2_128_64_cold_7();
    }
    else {
      ppVar3 = profile_00->matrix;
      if (ppVar3 == (parasail_matrix_t *)0x0) {
        parasail_sw_stats_striped_profile_sse2_128_64_cold_6();
      }
      else {
        uVar33 = profile_00->s1Len;
        uVar26 = (ulong)uVar33;
        if ((int)uVar33 < 1) {
          parasail_sw_stats_striped_profile_sse2_128_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_stats_striped_profile_sse2_128_64_cold_4();
        }
        else if (iVar2 < 0) {
          parasail_sw_stats_striped_profile_sse2_128_64_cold_3();
        }
        else if (open < 0) {
          parasail_sw_stats_striped_profile_sse2_128_64_cold_2();
        }
        else if (gap < 0) {
          parasail_sw_stats_striped_profile_sse2_128_64_cold_1();
        }
        else {
          pvVar5 = (profile_00->profile64).matches;
          pvVar6 = (profile_00->profile64).similar;
          iVar16 = ppVar3->max;
          result_00 = parasail_result_new_stats();
          if (result_00 != (parasail_result_t *)0x0) {
            uVar39 = uVar26 + 1 >> 1;
            result_00->flag = result_00->flag | 0x2810804;
            b = parasail_memalign___m128i(0x10,uVar39);
            palVar17 = parasail_memalign___m128i(0x10,uVar39);
            palVar18 = parasail_memalign___m128i(0x10,uVar39);
            palVar19 = parasail_memalign___m128i(0x10,uVar39);
            b_00 = parasail_memalign___m128i(0x10,uVar39);
            palVar20 = parasail_memalign___m128i(0x10,uVar39);
            b_01 = parasail_memalign___m128i(0x10,uVar39);
            palVar21 = parasail_memalign___m128i(0x10,uVar39);
            b_02 = parasail_memalign___m128i(0x10,uVar39);
            b_03 = parasail_memalign___m128i(0x10,uVar39);
            b_04 = parasail_memalign___m128i(0x10,uVar39);
            b_05 = parasail_memalign___m128i(0x10,uVar39);
            palVar22 = parasail_memalign___m128i(0x10,uVar39);
            local_1e0 = parasail_memalign___m128i(0x10,uVar39);
            local_1f0 = parasail_memalign___m128i(0x10,uVar39);
            local_1f8 = parasail_memalign___m128i(0x10,uVar39);
            auVar107._0_4_ = -(uint)((int)b == 0);
            auVar107._4_4_ = -(uint)((int)((ulong)b >> 0x20) == 0);
            auVar107._8_4_ = -(uint)((int)palVar17 == 0);
            auVar107._12_4_ = -(uint)((int)((ulong)palVar17 >> 0x20) == 0);
            auVar41._4_4_ = auVar107._0_4_;
            auVar41._0_4_ = auVar107._4_4_;
            auVar41._8_4_ = auVar107._12_4_;
            auVar41._12_4_ = auVar107._8_4_;
            auVar102._0_4_ = -(uint)((int)palVar18 == 0);
            auVar102._4_4_ = -(uint)((int)((ulong)palVar18 >> 0x20) == 0);
            auVar102._8_4_ = -(uint)((int)palVar19 == 0);
            auVar102._12_4_ = -(uint)((int)((ulong)palVar19 >> 0x20) == 0);
            auVar108._4_4_ = auVar102._0_4_;
            auVar108._0_4_ = auVar102._4_4_;
            auVar108._8_4_ = auVar102._12_4_;
            auVar108._12_4_ = auVar102._8_4_;
            auVar41 = packssdw(auVar41 & auVar107,auVar108 & auVar102);
            auVar80._0_4_ = -(uint)((int)b_00 == 0);
            auVar80._4_4_ = -(uint)((int)((ulong)b_00 >> 0x20) == 0);
            auVar80._8_4_ = -(uint)((int)palVar20 == 0);
            auVar80._12_4_ = -(uint)((int)((ulong)palVar20 >> 0x20) == 0);
            auVar103._4_4_ = auVar80._0_4_;
            auVar103._0_4_ = auVar80._4_4_;
            auVar103._8_4_ = auVar80._12_4_;
            auVar103._12_4_ = auVar80._8_4_;
            auVar44._0_4_ = -(uint)((int)b_01 == 0);
            auVar44._4_4_ = -(uint)((int)((ulong)b_01 >> 0x20) == 0);
            auVar44._8_4_ = -(uint)((int)palVar21 == 0);
            auVar44._12_4_ = -(uint)((int)((ulong)palVar21 >> 0x20) == 0);
            auVar112._4_4_ = auVar44._0_4_;
            auVar112._0_4_ = auVar44._4_4_;
            auVar112._8_4_ = auVar44._12_4_;
            auVar112._12_4_ = auVar44._8_4_;
            auVar104 = packssdw(auVar103 & auVar80,auVar112 & auVar44);
            auVar41 = packssdw(auVar41,auVar104);
            auVar129._0_4_ = -(uint)((int)b_02 == 0);
            auVar129._4_4_ = -(uint)((int)((ulong)b_02 >> 0x20) == 0);
            auVar129._8_4_ = -(uint)((int)b_03 == 0);
            auVar129._12_4_ = -(uint)((int)((ulong)b_03 >> 0x20) == 0);
            auVar54._4_4_ = auVar129._0_4_;
            auVar54._0_4_ = auVar129._4_4_;
            auVar54._8_4_ = auVar129._12_4_;
            auVar54._12_4_ = auVar129._8_4_;
            auVar98._0_4_ = -(uint)((int)b_04 == 0);
            auVar98._4_4_ = -(uint)((int)((ulong)b_04 >> 0x20) == 0);
            auVar98._8_4_ = -(uint)((int)b_05 == 0);
            auVar98._12_4_ = -(uint)((int)((ulong)b_05 >> 0x20) == 0);
            auVar134._4_4_ = auVar98._0_4_;
            auVar134._0_4_ = auVar98._4_4_;
            auVar134._8_4_ = auVar98._12_4_;
            auVar134._12_4_ = auVar98._8_4_;
            auVar98 = packssdw(auVar54 & auVar129,auVar134 & auVar98);
            auVar63._0_4_ = -(uint)((int)palVar22 == 0);
            auVar63._4_4_ = -(uint)((int)((ulong)palVar22 >> 0x20) == 0);
            auVar63._8_4_ = -(uint)((int)local_1e0 == 0);
            auVar63._12_4_ = -(uint)((int)((ulong)local_1e0 >> 0x20) == 0);
            auVar60._4_4_ = auVar63._0_4_;
            auVar60._0_4_ = auVar63._4_4_;
            auVar60._8_4_ = auVar63._12_4_;
            auVar60._12_4_ = auVar63._8_4_;
            auVar104._0_4_ = -(uint)((int)local_1f0 == 0);
            auVar104._4_4_ = -(uint)((int)((ulong)local_1f0 >> 0x20) == 0);
            auVar104._8_4_ = -(uint)((int)local_1f8 == 0);
            auVar104._12_4_ = -(uint)((int)((ulong)local_1f8 >> 0x20) == 0);
            auVar91._4_4_ = auVar104._0_4_;
            auVar91._0_4_ = auVar104._4_4_;
            auVar91._8_4_ = auVar104._12_4_;
            auVar91._12_4_ = auVar104._8_4_;
            auVar104 = packssdw(auVar60 & auVar63,auVar91 & auVar104);
            auVar104 = packssdw(auVar98,auVar104);
            auVar41 = packsswb(auVar41,auVar104);
            if ((((((((((((((((auVar41 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                             (auVar41 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar41 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar41 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar41 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar41 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar41 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar41 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar41 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar41 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar41 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar41 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar41 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar41 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar41 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                -1 < auVar41[0xf]) {
              local_188 = (undefined1  [16])0x0;
              uVar40 = (ulong)(uint)gap;
              c[1] = (longlong)b_03;
              c[0] = uVar39;
              palVar27 = b_00;
              parasail_memset___m128i(b,c,(size_t)b_00);
              c_00[1] = extraout_RDX;
              c_00[0] = uVar39;
              parasail_memset___m128i(palVar18,c_00,(size_t)palVar27);
              c_01[1] = extraout_RDX_00;
              c_01[0] = uVar39;
              parasail_memset___m128i(b_00,c_01,(size_t)palVar27);
              c_02[1] = extraout_RDX_01;
              c_02[0] = uVar39;
              parasail_memset___m128i(b_01,c_02,(size_t)palVar27);
              c_03[1] = extraout_RDX_02;
              c_03[0] = uVar39;
              parasail_memset___m128i(b_02,c_03,(size_t)palVar27);
              c_04[1] = extraout_RDX_03;
              c_04[0] = uVar39;
              parasail_memset___m128i(b_03,c_04,(size_t)palVar27);
              c_05[1] = extraout_RDX_04;
              c_05[0] = uVar39;
              parasail_memset___m128i(b_04,c_05,(size_t)palVar27);
              c_06[1] = extraout_RDX_05;
              c_06[0] = uVar39;
              parasail_memset___m128i(b_05,c_06,(size_t)palVar27);
              uVar8 = (uint)uVar39;
              uVar14 = uVar8 - 1;
              local_1a8 = 0;
              local_224 = 0;
              local_110 = 0;
              local_200 = -0x4000000000000000;
              auVar99 = (undefined1  [16])0x0;
              local_178 = (undefined1  [16])0x0;
              do {
                local_218 = b;
                palVar34 = b_01;
                ptr_02 = b_00;
                ptr_01 = palVar18;
                lVar35 = (long)(int)(ppVar3->mapper[(byte)s2[local_1a8]] * uVar8) * 0x10;
                iVar15 = (int)local_1a8 + -2;
                b_00 = palVar20;
                palVar27 = local_1e0;
                palVar18 = local_1f8;
                b_01 = palVar21;
                if (local_224 == iVar15) {
                  b_00 = local_1f0;
                  palVar27 = palVar19;
                  palVar18 = palVar21;
                  b_01 = local_1f8;
                }
                local_1f8 = palVar18;
                b = palVar17;
                palVar18 = palVar19;
                if (local_224 == iVar15) {
                  b = palVar22;
                  palVar18 = local_1e0;
                }
                lVar29 = palVar34[uVar14][0];
                lVar115 = 0;
                lVar24 = ptr_02[uVar14][0];
                lVar37 = 0;
                lVar135 = ptr_01[uVar14][0];
                lVar31 = 0;
                lVar72 = local_218[uVar14][0];
                lVar52 = 0;
                auVar41 = (undefined1  [16])0x0;
                auVar104 = (undefined1  [16])0x0;
                auVar105 = (undefined1  [16])0x0;
                lVar32 = 0;
                auVar110 = _DAT_009050f0;
                do {
                  plVar1 = (long *)((long)pvVar4 + lVar32 + lVar35);
                  lVar52 = lVar52 + *plVar1;
                  lVar73 = lVar72 + plVar1[1];
                  if (lVar52 < 1) {
                    lVar52 = 0;
                  }
                  if (lVar73 < 1) {
                    lVar73 = 0;
                  }
                  lVar28 = *(long *)((long)*b_02 + lVar32);
                  lVar38 = *(long *)((long)*b_02 + lVar32 + 8);
                  if (lVar28 < lVar52) {
                    lVar28 = lVar52;
                  }
                  if (lVar38 < lVar73) {
                    lVar38 = lVar73;
                  }
                  lVar23 = auVar105._0_8_;
                  lVar36 = lVar23;
                  if (lVar23 < lVar28) {
                    lVar36 = lVar28;
                  }
                  lVar53 = auVar105._8_8_;
                  lVar30 = lVar53;
                  if (lVar53 < lVar38) {
                    lVar30 = lVar38;
                  }
                  auVar63 = *(undefined1 (*) [16])((long)*b_03 + lVar32);
                  auVar111._8_8_ = -(ulong)(lVar30 == 0);
                  auVar111._0_8_ = -(ulong)(lVar36 == 0);
                  auVar79._8_8_ = -(ulong)(lVar30 == lVar73);
                  auVar79._0_8_ = -(ulong)(lVar36 == lVar52);
                  auVar139._8_8_ = -(ulong)(lVar38 <= lVar53);
                  auVar139._0_8_ = -(ulong)(lVar28 <= lVar23);
                  plVar1 = (long *)((long)*b_02 + lVar32);
                  lVar52 = *plVar1;
                  lVar73 = plVar1[1];
                  auVar91 = *(undefined1 (*) [16])((long)*b_04 + lVar32);
                  auVar98 = *(undefined1 (*) [16])((long)*b_05 + lVar32);
                  plVar1 = (long *)((long)*b + lVar32);
                  *plVar1 = lVar36;
                  plVar1[1] = lVar30;
                  plVar1 = (long *)((long)pvVar5 + lVar32 + lVar35);
                  auVar133._0_8_ = lVar31 + *plVar1;
                  auVar133._8_8_ = lVar135 + plVar1[1];
                  auVar129 = ~auVar111 &
                             (auVar133 & auVar79 |
                             ~auVar79 & (auVar139 & auVar104 | ~auVar139 & auVar63));
                  *(undefined1 (*) [16])((long)*palVar18 + lVar32) = auVar129;
                  auVar60 = _DAT_00904920;
                  plVar1 = (long *)((long)pvVar6 + lVar32 + lVar35);
                  auVar42._0_8_ = lVar37 + *plVar1;
                  auVar42._8_8_ = lVar24 + plVar1[1];
                  auVar134 = ~auVar111 &
                             (auVar42 & auVar79 |
                             ~auVar79 & (auVar139 & auVar41 | ~auVar139 & auVar91));
                  lVar37 = lVar36;
                  if (lVar36 <= (long)local_178._0_8_) {
                    lVar37 = local_178._0_8_;
                  }
                  lVar31 = lVar30;
                  if (lVar30 <= (long)local_178._8_8_) {
                    lVar31 = local_178._8_8_;
                  }
                  auVar43._8_4_ = 0xffffffff;
                  auVar43._0_8_ = 0xffffffffffffffff;
                  auVar43._12_4_ = 0xffffffff;
                  auVar116._0_8_ = lVar115 + 1;
                  auVar116._8_8_ = lVar29 - auVar43._8_8_;
                  auVar112 = ~auVar111 &
                             (auVar116 & auVar79 |
                             ~auVar79 & (auVar139 & auVar110 | ~auVar139 & auVar98));
                  auVar44 = auVar129 ^ _DAT_00904920;
                  auVar54 = local_188 ^ _DAT_00904920;
                  iVar78 = -(uint)(auVar44._0_4_ < auVar54._0_4_);
                  iVar92 = -(uint)(auVar44._4_4_ < auVar54._4_4_);
                  iVar94 = -(uint)(auVar44._8_4_ < auVar54._8_4_);
                  iVar96 = -(uint)(auVar44._12_4_ < auVar54._12_4_);
                  auVar55._4_4_ = -(uint)(auVar54._4_4_ == auVar44._4_4_);
                  auVar55._12_4_ = -(uint)(auVar54._12_4_ == auVar44._12_4_);
                  auVar45._4_4_ = iVar78;
                  auVar45._0_4_ = iVar78;
                  auVar45._8_4_ = iVar94;
                  auVar45._12_4_ = iVar94;
                  auVar55._0_4_ = auVar55._4_4_;
                  auVar55._8_4_ = auVar55._12_4_;
                  auVar46._4_4_ = iVar92;
                  auVar46._0_4_ = iVar92;
                  auVar46._8_4_ = iVar96;
                  auVar46._12_4_ = iVar96;
                  auVar46 = auVar46 | auVar55 & auVar45;
                  auVar44 = ~auVar46 & auVar129 | local_188 & auVar46;
                  auVar54 = auVar44 ^ _DAT_00904920;
                  auVar80 = auVar134 ^ _DAT_00904920;
                  iVar78 = -(uint)(auVar80._0_4_ < auVar54._0_4_);
                  iVar92 = -(uint)(auVar80._4_4_ < auVar54._4_4_);
                  iVar94 = -(uint)(auVar80._8_4_ < auVar54._8_4_);
                  iVar96 = -(uint)(auVar80._12_4_ < auVar54._12_4_);
                  auVar81._4_4_ = -(uint)(auVar80._4_4_ == auVar54._4_4_);
                  auVar81._12_4_ = -(uint)(auVar80._12_4_ == auVar54._12_4_);
                  auVar56._4_4_ = iVar78;
                  auVar56._0_4_ = iVar78;
                  auVar56._8_4_ = iVar94;
                  auVar56._12_4_ = iVar94;
                  auVar81._0_4_ = auVar81._4_4_;
                  auVar81._8_4_ = auVar81._12_4_;
                  auVar57._4_4_ = iVar92;
                  auVar57._0_4_ = iVar92;
                  auVar57._8_4_ = iVar96;
                  auVar57._12_4_ = iVar96;
                  auVar57 = auVar57 | auVar81 & auVar56;
                  auVar54 = ~auVar57 & auVar134 | auVar44 & auVar57;
                  auVar44 = auVar54 ^ _DAT_00904920;
                  auVar80 = auVar112 ^ _DAT_00904920;
                  iVar78 = -(uint)(auVar80._0_4_ < auVar44._0_4_);
                  iVar92 = -(uint)(auVar80._4_4_ < auVar44._4_4_);
                  iVar94 = -(uint)(auVar80._8_4_ < auVar44._8_4_);
                  iVar96 = -(uint)(auVar80._12_4_ < auVar44._12_4_);
                  auVar82._4_4_ = -(uint)(auVar80._4_4_ == auVar44._4_4_);
                  auVar82._12_4_ = -(uint)(auVar80._12_4_ == auVar44._12_4_);
                  auVar47._4_4_ = iVar78;
                  auVar47._0_4_ = iVar78;
                  auVar47._8_4_ = iVar94;
                  auVar47._12_4_ = iVar94;
                  auVar82._0_4_ = auVar82._4_4_;
                  auVar82._8_4_ = auVar82._12_4_;
                  auVar136._4_4_ = iVar92;
                  auVar136._0_4_ = iVar92;
                  auVar136._8_4_ = iVar96;
                  auVar136._12_4_ = iVar96;
                  auVar136 = auVar136 | auVar82 & auVar47;
                  local_188 = ~auVar136 & auVar112 | auVar54 & auVar136;
                  local_178._8_8_ = lVar31;
                  local_178._0_8_ = lVar37;
                  uStack_60 = (ulong)(uint)open;
                  auVar124._0_8_ = lVar36 - (ulong)(uint)open;
                  auVar124._8_8_ = lVar30 - uStack_60;
                  uStack_1c0 = (ulong)(uint)gap;
                  auVar75._0_8_ = lVar52 - uVar40;
                  auVar75._8_8_ = lVar73 - uStack_1c0;
                  auVar54 = auVar75 ^ _DAT_00904920;
                  auVar44 = auVar124 ^ _DAT_00904920;
                  iVar94 = -(uint)(auVar54._0_4_ < auVar44._0_4_);
                  iVar93 = auVar44._4_4_;
                  iVar96 = -(uint)(auVar54._4_4_ < iVar93);
                  iVar128 = auVar44._12_4_;
                  iVar95 = -(uint)(auVar54._8_4_ < auVar44._8_4_);
                  iVar97 = -(uint)(auVar54._12_4_ < iVar128);
                  iVar78 = -(uint)(auVar54._4_4_ == iVar93);
                  iVar92 = -(uint)(auVar54._12_4_ == iVar128);
                  auVar117._4_4_ = iVar78;
                  auVar117._0_4_ = iVar78;
                  auVar117._8_4_ = iVar92;
                  auVar117._12_4_ = iVar92;
                  auVar58._4_4_ = iVar94;
                  auVar58._0_4_ = iVar94;
                  auVar58._8_4_ = iVar95;
                  auVar58._12_4_ = iVar95;
                  auVar59._4_4_ = iVar96;
                  auVar59._0_4_ = iVar96;
                  auVar59._8_4_ = iVar97;
                  auVar59._12_4_ = iVar97;
                  auVar59 = auVar59 | auVar117 & auVar58;
                  *(undefined1 (*) [16])((long)*b_00 + lVar32) = auVar134;
                  *(undefined1 (*) [16])((long)*b_01 + lVar32) = auVar112;
                  local_138 = auVar98._0_8_;
                  lStack_130 = auVar98._8_8_;
                  auVar101._8_4_ = 0xffffffff;
                  auVar101._0_8_ = 0xffffffffffffffff;
                  auVar101._12_4_ = 0xffffffff;
                  auVar100._0_8_ = local_138 + 1;
                  auVar100._8_8_ = lStack_130 - auVar101._8_8_;
                  auVar113._0_8_ = auVar112._0_8_ + 1;
                  auVar113._8_8_ = auVar112._8_8_ - auVar101._8_8_;
                  *(undefined1 (*) [16])((long)*b_02 + lVar32) =
                       auVar124 & auVar59 | ~auVar59 & auVar75;
                  *(undefined1 (*) [16])((long)*b_03 + lVar32) =
                       ~auVar59 & auVar63 | auVar129 & auVar59;
                  *(undefined1 (*) [16])((long)*b_04 + lVar32) =
                       ~auVar59 & auVar91 | auVar134 & auVar59;
                  *(undefined1 (*) [16])((long)*b_05 + lVar32) =
                       ~auVar59 & auVar100 | auVar113 & auVar59;
                  auVar106._0_8_ = lVar23 - uVar40;
                  auVar106._8_8_ = lVar53 - uStack_1c0;
                  auVar60 = auVar106 ^ auVar60;
                  iVar78 = -(uint)(auVar60._0_4_ < auVar44._0_4_);
                  iVar92 = -(uint)(auVar60._4_4_ < iVar93);
                  iVar94 = -(uint)(auVar60._8_4_ < auVar44._8_4_);
                  iVar96 = -(uint)(auVar60._12_4_ < iVar128);
                  auVar61._4_4_ = -(uint)(auVar60._4_4_ == iVar93);
                  auVar61._12_4_ = -(uint)(auVar60._12_4_ == iVar128);
                  auVar48._4_4_ = iVar78;
                  auVar48._0_4_ = iVar78;
                  auVar48._8_4_ = iVar94;
                  auVar48._12_4_ = iVar94;
                  auVar61._0_4_ = auVar61._4_4_;
                  auVar61._8_4_ = auVar61._12_4_;
                  auVar49._4_4_ = iVar92;
                  auVar49._0_4_ = iVar92;
                  auVar49._8_4_ = iVar96;
                  auVar49._12_4_ = iVar96;
                  auVar49 = auVar49 | auVar61 & auVar48;
                  auVar105 = auVar124 & auVar49 | ~auVar49 & auVar106;
                  auVar104 = ~auVar49 & auVar104 | auVar129 & auVar49;
                  auVar41 = ~auVar49 & auVar41 | auVar134 & auVar49;
                  auVar109._0_8_ = auVar110._0_8_ + 1;
                  auVar109._8_8_ = auVar110._8_8_ + 1;
                  auVar110 = ~auVar49 & auVar109 | auVar113 & auVar49;
                  plVar1 = (long *)((long)*local_218 + lVar32);
                  lVar52 = *plVar1;
                  lVar72 = plVar1[1];
                  plVar1 = (long *)((long)*ptr_01 + lVar32);
                  lVar31 = *plVar1;
                  lVar135 = plVar1[1];
                  plVar1 = (long *)((long)*ptr_02 + lVar32);
                  lVar37 = *plVar1;
                  lVar24 = plVar1[1];
                  plVar1 = (long *)((long)*palVar34 + lVar32);
                  lVar115 = *plVar1;
                  lVar29 = plVar1[1];
                  lVar32 = lVar32 + 0x10;
                } while (uVar39 << 4 != lVar32);
                if (local_224 == iVar15) {
                  palVar22 = palVar17;
                  local_1f0 = palVar20;
                }
                bVar11 = true;
                do {
                  bVar25 = bVar11;
                  auVar110._8_8_ = auVar110._0_8_;
                  auVar110._0_8_ = 1;
                  auVar9._8_8_ = 0;
                  auVar9._0_8_ = auVar41._0_8_;
                  auVar41 = auVar9 << 0x40;
                  auVar10._8_8_ = 0;
                  auVar10._0_8_ = auVar104._0_8_;
                  auVar104 = auVar10 << 0x40;
                  auVar105._8_8_ = auVar105._0_8_;
                  auVar105._0_8_ = (long)-open;
                  lVar29 = local_218[uVar14][0];
                  lVar37 = 0;
                  lVar52 = 0;
                  do {
                    auVar91 = _DAT_00904920;
                    plVar1 = (long *)((long)pvVar4 + lVar52 + lVar35);
                    auVar86._0_8_ = lVar37 + *plVar1;
                    auVar86._8_8_ = lVar29 + plVar1[1];
                    auVar63 = *(undefined1 (*) [16])((long)*b + lVar52);
                    auVar98 = auVar105 ^ _DAT_00904920;
                    auVar60 = auVar63 ^ _DAT_00904920;
                    iVar15 = -(uint)(auVar98._0_4_ < auVar60._0_4_);
                    auVar76._4_4_ = -(uint)(auVar98._4_4_ < auVar60._4_4_);
                    iVar78 = -(uint)(auVar98._8_4_ < auVar60._8_4_);
                    auVar76._12_4_ = -(uint)(auVar98._12_4_ < auVar60._12_4_);
                    auVar83._4_4_ = iVar15;
                    auVar83._0_4_ = iVar15;
                    auVar83._8_4_ = iVar78;
                    auVar83._12_4_ = iVar78;
                    iVar15 = -(uint)(auVar60._4_4_ == auVar98._4_4_);
                    iVar78 = -(uint)(auVar60._12_4_ == auVar98._12_4_);
                    auVar62._4_4_ = iVar15;
                    auVar62._0_4_ = iVar15;
                    auVar62._8_4_ = iVar78;
                    auVar62._12_4_ = iVar78;
                    auVar76._0_4_ = auVar76._4_4_;
                    auVar76._8_4_ = auVar76._12_4_;
                    auVar76 = auVar76 | auVar62 & auVar83;
                    auVar44 = auVar63 & auVar76 | ~auVar76 & auVar105;
                    *(undefined1 (*) [16])((long)*b + lVar52) = auVar44;
                    auVar63 = auVar86 ^ auVar91;
                    iVar15 = -(uint)(auVar91._0_4_ < auVar63._0_4_);
                    iVar95 = auVar91._4_4_;
                    iVar78 = -(uint)(iVar95 < auVar63._4_4_);
                    iVar92 = -(uint)(auVar91._8_4_ < auVar63._8_4_);
                    iVar128 = auVar91._12_4_;
                    iVar94 = -(uint)(iVar128 < auVar63._12_4_);
                    auVar84._4_4_ = iVar15;
                    auVar84._0_4_ = iVar15;
                    auVar84._8_4_ = iVar92;
                    auVar84._12_4_ = iVar92;
                    auVar64._4_4_ = -(uint)(auVar63._4_4_ == iVar95);
                    auVar64._12_4_ = -(uint)(auVar63._12_4_ == iVar128);
                    auVar64._0_4_ = auVar64._4_4_;
                    auVar64._8_4_ = auVar64._12_4_;
                    auVar85._4_4_ = iVar78;
                    auVar85._0_4_ = iVar78;
                    auVar85._8_4_ = iVar94;
                    auVar85._12_4_ = iVar94;
                    auVar86 = (auVar85 | auVar64 & auVar84) & auVar86;
                    auVar87._0_4_ = -(uint)(auVar86._0_4_ == auVar44._0_4_);
                    auVar87._4_4_ = -(uint)(auVar86._4_4_ == auVar44._4_4_);
                    auVar87._8_4_ = -(uint)(auVar86._8_4_ == auVar44._8_4_);
                    auVar87._12_4_ = -(uint)(auVar86._12_4_ == auVar44._12_4_);
                    auVar74._4_4_ = auVar87._0_4_;
                    auVar74._0_4_ = auVar87._4_4_;
                    auVar74._8_4_ = auVar87._12_4_;
                    auVar74._12_4_ = auVar87._8_4_;
                    auVar76 = auVar74 & auVar87 | auVar76;
                    auVar63 = ~auVar76 & auVar104 |
                              *(undefined1 (*) [16])((long)*palVar18 + lVar52) & auVar76;
                    *(undefined1 (*) [16])((long)*palVar18 + lVar52) = auVar63;
                    auVar129 = ~auVar76 & auVar41 |
                               *(undefined1 (*) [16])((long)*b_00 + lVar52) & auVar76;
                    *(undefined1 (*) [16])((long)*b_00 + lVar52) = auVar129;
                    auVar60 = ~auVar76 & auVar110 |
                              *(undefined1 (*) [16])((long)*b_01 + lVar52) & auVar76;
                    auVar98 = auVar63 ^ auVar91;
                    auVar134 = local_188 ^ auVar91;
                    iVar15 = -(uint)(auVar98._0_4_ < auVar134._0_4_);
                    iVar92 = -(uint)(auVar98._4_4_ < auVar134._4_4_);
                    iVar78 = -(uint)(auVar98._8_4_ < auVar134._8_4_);
                    iVar94 = -(uint)(auVar98._12_4_ < auVar134._12_4_);
                    auVar125._4_4_ = iVar15;
                    auVar125._0_4_ = iVar15;
                    auVar125._8_4_ = iVar78;
                    auVar125._12_4_ = iVar78;
                    iVar15 = -(uint)(auVar134._4_4_ == auVar98._4_4_);
                    iVar78 = -(uint)(auVar134._12_4_ == auVar98._12_4_);
                    auVar65._4_4_ = iVar15;
                    auVar65._0_4_ = iVar15;
                    auVar65._8_4_ = iVar78;
                    auVar65._12_4_ = iVar78;
                    auVar88._4_4_ = iVar92;
                    auVar88._0_4_ = iVar92;
                    auVar88._8_4_ = iVar94;
                    auVar88._12_4_ = iVar94;
                    auVar88 = auVar88 | auVar65 & auVar125;
                    auVar134 = ~auVar88 & auVar63 | local_188 & auVar88;
                    auVar98 = auVar134 ^ auVar91;
                    auVar54 = auVar129 ^ auVar91;
                    iVar15 = -(uint)(auVar54._0_4_ < auVar98._0_4_);
                    iVar92 = -(uint)(auVar54._4_4_ < auVar98._4_4_);
                    iVar78 = -(uint)(auVar54._8_4_ < auVar98._8_4_);
                    iVar94 = -(uint)(auVar54._12_4_ < auVar98._12_4_);
                    auVar130._4_4_ = iVar15;
                    auVar130._0_4_ = iVar15;
                    auVar130._8_4_ = iVar78;
                    auVar130._12_4_ = iVar78;
                    iVar15 = -(uint)(auVar54._4_4_ == auVar98._4_4_);
                    iVar78 = -(uint)(auVar54._12_4_ == auVar98._12_4_);
                    auVar66._4_4_ = iVar15;
                    auVar66._0_4_ = iVar15;
                    auVar66._8_4_ = iVar78;
                    auVar66._12_4_ = iVar78;
                    auVar118._4_4_ = iVar92;
                    auVar118._0_4_ = iVar92;
                    auVar118._8_4_ = iVar94;
                    auVar118._12_4_ = iVar94;
                    auVar118 = auVar118 | auVar66 & auVar130;
                    auVar54 = ~auVar118 & auVar129 | auVar134 & auVar118;
                    auVar98 = auVar54 ^ auVar91;
                    auVar134 = auVar60 ^ auVar91;
                    iVar15 = -(uint)(auVar134._0_4_ < auVar98._0_4_);
                    iVar92 = -(uint)(auVar134._4_4_ < auVar98._4_4_);
                    iVar78 = -(uint)(auVar134._8_4_ < auVar98._8_4_);
                    iVar94 = -(uint)(auVar134._12_4_ < auVar98._12_4_);
                    auVar131._4_4_ = iVar15;
                    auVar131._0_4_ = iVar15;
                    auVar131._8_4_ = iVar78;
                    auVar131._12_4_ = iVar78;
                    iVar15 = -(uint)(auVar134._4_4_ == auVar98._4_4_);
                    iVar78 = -(uint)(auVar134._12_4_ == auVar98._12_4_);
                    auVar67._4_4_ = iVar15;
                    auVar67._0_4_ = iVar15;
                    auVar67._8_4_ = iVar78;
                    auVar67._12_4_ = iVar78;
                    auVar137._4_4_ = iVar92;
                    auVar137._0_4_ = iVar92;
                    auVar137._8_4_ = iVar94;
                    auVar137._12_4_ = iVar94;
                    auVar137 = auVar137 | auVar67 & auVar131;
                    local_188 = ~auVar137 & auVar60 | auVar54 & auVar137;
                    auVar98 = auVar44 ^ auVar91;
                    auVar134 = local_178 ^ auVar91;
                    iVar15 = -(uint)(auVar134._0_4_ < auVar98._0_4_);
                    iVar92 = -(uint)(auVar134._4_4_ < auVar98._4_4_);
                    iVar78 = -(uint)(auVar134._8_4_ < auVar98._8_4_);
                    iVar94 = -(uint)(auVar134._12_4_ < auVar98._12_4_);
                    auVar126._4_4_ = iVar15;
                    auVar126._0_4_ = iVar15;
                    auVar126._8_4_ = iVar78;
                    auVar126._12_4_ = iVar78;
                    iVar15 = -(uint)(auVar134._4_4_ == auVar98._4_4_);
                    iVar78 = -(uint)(auVar134._12_4_ == auVar98._12_4_);
                    auVar68._4_4_ = iVar15;
                    auVar68._0_4_ = iVar15;
                    auVar68._8_4_ = iVar78;
                    auVar68._12_4_ = iVar78;
                    auVar89._4_4_ = iVar92;
                    auVar89._0_4_ = iVar92;
                    auVar89._8_4_ = iVar94;
                    auVar89._12_4_ = iVar94;
                    auVar89 = auVar89 | auVar68 & auVar126;
                    local_178 = ~auVar89 & local_178 | auVar44 & auVar89;
                    auVar114._0_8_ = auVar44._0_8_ - (ulong)(uint)open;
                    auVar114._8_8_ = auVar44._8_8_ - uStack_60;
                    lVar37 = auVar105._8_8_;
                    auVar105._0_8_ = auVar105._0_8_ - uVar40;
                    auVar105._8_8_ = lVar37 - uStack_1c0;
                    auVar98 = auVar105 ^ auVar91;
                    iVar78 = auVar98._0_4_;
                    iVar15 = -(uint)(auVar91._0_4_ < iVar78);
                    iVar92 = auVar98._4_4_;
                    auVar90._4_4_ = -(uint)(iVar95 < iVar92);
                    iVar96 = auVar98._8_4_;
                    iVar93 = auVar98._12_4_;
                    iVar94 = -(uint)(auVar91._8_4_ < iVar96);
                    auVar90._12_4_ = -(uint)(iVar128 < iVar93);
                    auVar119._4_4_ = iVar15;
                    auVar119._0_4_ = iVar15;
                    auVar119._8_4_ = iVar94;
                    auVar119._12_4_ = iVar94;
                    auVar127._4_4_ = -(uint)(iVar92 == iVar95);
                    auVar127._12_4_ = -(uint)(iVar93 == iVar128);
                    auVar127._0_4_ = auVar127._4_4_;
                    auVar127._8_4_ = auVar127._12_4_;
                    auVar120._0_4_ = -(uint)((int)auVar105._0_8_ == (int)auVar114._0_8_);
                    auVar120._4_4_ =
                         -(uint)((int)((ulong)auVar105._0_8_ >> 0x20) ==
                                (int)((ulong)auVar114._0_8_ >> 0x20));
                    auVar120._8_4_ = -(uint)((int)auVar105._8_8_ == (int)auVar114._8_8_);
                    auVar120._12_4_ =
                         -(uint)((int)((ulong)auVar105._8_8_ >> 0x20) ==
                                (int)((ulong)auVar114._8_8_ >> 0x20));
                    auVar114 = auVar114 ^ auVar91;
                    auVar90._0_4_ = auVar90._4_4_;
                    auVar90._8_4_ = auVar90._12_4_;
                    iVar95 = -(uint)(auVar114._0_4_ < iVar78);
                    iVar15 = auVar114._4_4_;
                    iVar128 = -(uint)(auVar114._8_4_ < iVar96);
                    iVar94 = auVar114._12_4_;
                    auVar121._4_4_ = auVar120._0_4_;
                    auVar121._0_4_ = auVar120._4_4_;
                    auVar121._8_4_ = auVar120._12_4_;
                    auVar121._12_4_ = auVar120._8_4_;
                    auVar132._4_4_ = iVar95;
                    auVar132._0_4_ = iVar95;
                    auVar132._8_4_ = iVar128;
                    auVar132._12_4_ = iVar128;
                    auVar122._4_4_ = -(uint)(iVar15 < iVar92);
                    auVar122._0_4_ = -(uint)(iVar15 < iVar92);
                    auVar122._8_4_ = -(uint)(iVar94 < iVar93);
                    auVar122._12_4_ = -(uint)(iVar94 < iVar93);
                    auVar123._4_4_ = -(uint)(iVar92 == iVar15);
                    auVar123._12_4_ = -(uint)(iVar93 == iVar94);
                    auVar123._0_4_ = auVar123._4_4_;
                    auVar123._8_4_ = auVar123._12_4_;
                    auVar91 = (auVar90 | auVar127 & auVar119) & auVar120 & auVar121 | auVar122 |
                              auVar132 & auVar123;
                    uVar7 = (ushort)(SUB161(auVar91 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar91 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar91 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar91 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar91 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar91 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar91 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar91 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar91 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar91 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar91 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar91 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar91 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar91 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar91 >> 0x77,0) & 1) << 0xe |
                            (ushort)(byte)(auVar91[0xf] >> 7) << 0xf;
                    *(undefined1 (*) [16])((long)*b_01 + lVar52) = auVar60;
                    if (uVar7 == 0) goto LAB_0059ee07;
                    iVar78 = -(uint)(iVar78 < auVar114._0_4_);
                    iVar96 = -(uint)(iVar96 < auVar114._8_4_);
                    auVar69._4_4_ = iVar78;
                    auVar69._0_4_ = iVar78;
                    auVar69._8_4_ = iVar96;
                    auVar69._12_4_ = iVar96;
                    auVar70._4_4_ = -(uint)(iVar92 < iVar15);
                    auVar70._0_4_ = -(uint)(iVar92 < iVar15);
                    auVar70._8_4_ = -(uint)(iVar93 < iVar94);
                    auVar70._12_4_ = -(uint)(iVar93 < iVar94);
                    auVar70 = auVar70 | auVar123 & auVar69;
                    auVar104 = auVar63 & auVar70 | ~auVar70 & auVar104;
                    auVar41 = auVar129 & auVar70 | ~auVar70 & auVar41;
                    auVar63 = ~auVar70 & auVar110 | auVar60 & auVar70;
                    auVar110._0_8_ = auVar63._0_8_ + 1;
                    auVar110._8_8_ = auVar63._8_8_ + 1;
                    plVar1 = (long *)((long)*local_218 + lVar52);
                    lVar37 = *plVar1;
                    lVar29 = plVar1[1];
                    lVar52 = lVar52 + 0x10;
                  } while (uVar39 << 4 != lVar52);
                  bVar11 = false;
                } while (bVar25);
LAB_0059ee07:
                auVar41 = auVar99 ^ _DAT_00904920;
                auVar104 = local_178 ^ _DAT_00904920;
                iVar15 = -(uint)(auVar41._0_4_ < auVar104._0_4_);
                iVar92 = -(uint)(auVar41._4_4_ < auVar104._4_4_);
                iVar78 = -(uint)(auVar41._8_4_ < auVar104._8_4_);
                iVar94 = -(uint)(auVar41._12_4_ < auVar104._12_4_);
                auVar77._4_4_ = iVar15;
                auVar77._0_4_ = iVar15;
                auVar77._8_4_ = iVar78;
                auVar77._12_4_ = iVar78;
                iVar15 = -(uint)(auVar104._4_4_ == auVar41._4_4_);
                iVar78 = -(uint)(auVar104._12_4_ == auVar41._12_4_);
                auVar50._4_4_ = iVar15;
                auVar50._0_4_ = iVar15;
                auVar50._8_4_ = iVar78;
                auVar50._12_4_ = iVar78;
                auVar71._4_4_ = iVar92;
                auVar71._0_4_ = iVar92;
                auVar71._8_4_ = iVar94;
                auVar71._12_4_ = iVar94;
                iVar15 = movmskps((uint)uVar7,auVar71 | auVar50 & auVar77);
                if (iVar15 != 0) {
                  local_200 = local_178._8_8_;
                  if (local_178._8_8_ < local_178._0_8_) {
                    local_200 = local_178._0_8_;
                  }
                  if ((long)(~(long)iVar16 + 0x7fffffffffffffffU) < local_200) {
                    *(byte *)&result_00->flag = (byte)result_00->flag | 0x40;
                    goto LAB_0059eef9;
                  }
                  auVar99._8_4_ = (int)local_200;
                  auVar99._0_8_ = local_200;
                  auVar99._12_4_ = (int)((ulong)local_200 >> 0x20);
                  local_224 = (int)local_1a8;
                }
                local_1a8 = local_1a8 + 1;
                palVar21 = palVar34;
                palVar17 = local_218;
                palVar19 = ptr_01;
                palVar20 = ptr_02;
                local_1e0 = palVar27;
              } while (local_1a8 != iVar2 + 1U);
              local_1a8 = (ulong)(iVar2 + 1U);
LAB_0059eef9:
              if ((local_200 == 0x7fffffffffffffff) ||
                 (auVar138._0_4_ = -(uint)(local_188._0_4_ == -1),
                 auVar138._4_4_ = -(uint)(local_188._4_4_ == 0x7fffffff),
                 auVar138._8_4_ = -(uint)(local_188._8_4_ == -1),
                 auVar138._12_4_ = -(uint)(local_188._12_4_ == 0x7fffffff),
                 auVar51._4_4_ = auVar138._0_4_, auVar51._0_4_ = auVar138._4_4_,
                 auVar51._8_4_ = auVar138._12_4_, auVar51._12_4_ = auVar138._8_4_,
                 iVar16 = movmskps(0xffffffff,auVar51 & auVar138), iVar16 != 0)) {
                *(byte *)&result_00->flag = (byte)result_00->flag | 0x40;
              }
              iVar16 = parasail_result_is_saturated(result_00);
              iVar15 = 0;
              local_1e8 = palVar34;
              palVar21 = local_218;
              if (iVar16 == 0) {
                palVar19 = palVar27;
                palVar20 = b_00;
                ptr = b_01;
                palVar17 = palVar18;
                ptr_00 = b;
                palVar12 = palVar22;
                local_210 = local_1f8;
                local_208 = local_1f0;
                if ((local_224 != (int)local_1a8 + -1) &&
                   (palVar19 = palVar18, palVar20 = local_1f0, ptr = local_1f8, palVar17 = palVar27,
                   ptr_00 = palVar22, palVar12 = b, local_210 = b_01, local_208 = b_00,
                   local_224 == (int)local_1a8 + -2)) {
                  local_1e8 = local_1f8;
                  palVar20 = ptr_02;
                  ptr = palVar34;
                  palVar17 = ptr_01;
                  ptr_00 = local_218;
                  palVar21 = palVar22;
                  ptr_01 = palVar27;
                  ptr_02 = local_1f0;
                }
                local_218 = palVar12;
                if ((uVar26 + 1 & 0x7ffffffe) == 0) {
                  iVar15 = 0;
                  iVar78 = 0;
                  iVar16 = 0;
                }
                else {
                  uVar39 = 0;
                  lVar29 = 0;
                  lVar24 = 0;
                  do {
                    if ((*ptr_00)[uVar39] == local_200) {
                      uVar33 = 0;
                      if ((uVar39 & 1) != 0) {
                        uVar33 = uVar8;
                      }
                      uVar33 = uVar33 + ((uint)(uVar39 >> 1) & 0x7fffffff);
                      if ((int)uVar33 < (int)uVar26) {
                        local_110 = (*palVar17)[uVar39];
                        lVar29 = (*palVar20)[uVar39];
                        lVar24 = (*ptr)[uVar39];
                        uVar26 = (ulong)uVar33;
                      }
                    }
                    iVar78 = (int)lVar24;
                    iVar15 = (int)lVar29;
                    uVar33 = (uint)uVar26;
                    uVar39 = uVar39 + 1;
                  } while ((uVar8 & 0x3fffffff) * 2 != (int)uVar39);
                  iVar16 = (int)local_110;
                }
                iVar92 = (int)local_200;
              }
              else {
                iVar78 = 0;
                iVar16 = 0;
                iVar92 = 0;
                local_224 = 0;
                uVar33 = 0;
                palVar19 = palVar18;
                ptr = local_1f8;
                palVar20 = local_1f0;
                local_218 = b;
                local_210 = b_01;
                local_208 = b_00;
                palVar17 = palVar27;
                ptr_00 = palVar22;
              }
              result_00->score = iVar92;
              result_00->end_query = uVar33;
              result_00->end_ref = local_224;
              ((result_00->field_4).stats)->matches = iVar16;
              ((result_00->field_4).stats)->similar = iVar15;
              ((result_00->field_4).stats)->length = iVar78;
              parasail_free(ptr);
              parasail_free(palVar20);
              parasail_free(palVar17);
              parasail_free(ptr_00);
              parasail_free(b_05);
              parasail_free(b_04);
              parasail_free(b_03);
              parasail_free(b_02);
              parasail_free(local_1e8);
              parasail_free(local_210);
              parasail_free(ptr_02);
              parasail_free(local_208);
              parasail_free(ptr_01);
              parasail_free(palVar19);
              parasail_free(palVar21);
              parasail_free(local_218);
            }
            else {
              result_00 = (parasail_result_t *)0x0;
            }
            goto LAB_0059f1da;
          }
        }
      }
    }
  }
  result_00 = (parasail_result_t *)0x0;
LAB_0059f1da:
  parasail_profile_free(profile_00);
  parasail_result_free(result);
  result_00->end_query = iVar13;
  result_00->end_ref = iVar2;
  return result_00;
}

Assistant:

parasail_result_t* INAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    const char *s1 = profile->s1;
    const parasail_matrix_t *matrix = profile->matrix;

    /* find the end loc first with the faster implementation */
    parasail_result_t *result = parasail_sw_striped_profile_sse2_128_64(profile, s2, s2Len, open, gap);
    if (!parasail_result_is_saturated(result)) {
#if 0
        int s1Len_new = 0;
        int s2Len_new = 0;
        char *s1_new = NULL;
        char *s2_new = NULL;
        parasail_profile_t *profile_new = NULL;
        parasail_result_t *result_new = NULL;
        int s1_begin = 0;
        int s2_begin = 0;
        int s1Len_final = 0;
        int s2Len_final = 0;
        parasail_profile_t *profile_final = NULL;
        parasail_result_t *result_final = NULL;

        /* using the end loc and the non-stats version of the function,
         * reverse the inputs and find the beg loc */
        s1Len_new = result->end_query+1;
        s2Len_new = result->end_ref+1;
        s1_new = parasail_reverse(s1, s1Len_new);
        s2_new = parasail_reverse(s2, s2Len_new);
        profile_new = parasail_profile_create_sse_128_64(
                s1_new, s1Len_new, matrix);
        profile_new->stop = result->score;
        result_new = parasail_sw_striped_profile_sse2_128_64(
                profile_new, s2_new, s2Len_new, open, gap);

        /* using both the beg and end loc, call the original stats func */
        s1_begin = s1Len_new - result_new->end_query - 1;
        s2_begin = s2Len_new - result_new->end_ref - 1;
        s1Len_final = s1Len_new - s1_begin;
        s2Len_final = s2Len_new - s2_begin;
        assert(s1_begin >= 0);
        assert(s2_begin >= 0);
        assert(s1Len_new > s1_begin);
        assert(s2Len_new > s2_begin);
        profile_final = parasail_profile_create_stats_sse_128_64(
                &s1[s1_begin], s1Len_final, matrix);
        result_final = PNAME(
                profile_final, &s2[s2_begin], s2Len_final, open, gap);

        /* clean up all the temporary profiles, sequences, and results */
        free(s1_new);
        free(s2_new);
        parasail_profile_free(profile_new);
        parasail_profile_free(profile_final);
        parasail_result_free(result);
        parasail_result_free(result_new);

        /* correct the end locations before returning */
        result_final->end_query = s1Len_new-1;
        result_final->end_ref = s2Len_new-1;
        return result_final;
#else
        int s1Len_new = 0;
        int s2Len_new = 0;
        parasail_profile_t *profile_final = NULL;
        parasail_result_t *result_final = NULL;

        /* using the end loc, call the original stats function */
        s1Len_new = result->end_query+1;
        s2Len_new = result->end_ref+1;
        profile_final = parasail_profile_create_stats_sse_128_64(
                s1, s1Len_new, matrix);
        result_final = PNAME(
                profile_final, s2, s2Len_new, open, gap);

        /* clean up all the temporary profiles, sequences, and results */
        parasail_profile_free(profile_final);
        parasail_result_free(result);

        /* correct the end locations before returning */
        result_final->end_query = s1Len_new-1;
        result_final->end_ref = s2Len_new-1;
        return result_final;
#endif
    }
    else {
        return result;
    }
}